

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cal_energy.cpp
# Opt level: O1

void Clash_detection_list
               (Structure *conf,vector<int,_std::allocator<int>_> *starts,
               vector<int,_std::allocator<int>_> *ends,vector<int,_std::allocator<int>_> *ResIdx,
               vector<int,_std::allocator<int>_> *ClashNum,vector<int,_std::allocator<int>_> *List)

{
  short sVar1;
  int iVar2;
  int iVar3;
  Atom *pAVar4;
  iterator iVar5;
  int iVar6;
  Atom *pAVar7;
  Residue *pRVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  int clash_count;
  int local_90;
  int local_8c;
  vector<int,_std::allocator<int>_> *local_88;
  ulong local_80;
  ulong local_78;
  vector<int,_std::allocator<int>_> *local_70;
  vector<int,_std::allocator<int>_> *local_68;
  vector<int,std::allocator<int>> *local_60;
  vector<int,std::allocator<int>> *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_78 = (ulong)((long)(starts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(starts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
  if (0 < (int)local_78) {
    local_50 = (ulong)((long)(List->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(List->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 2;
    local_78 = local_78 & 0x7fffffff;
    local_48 = local_50 & 0x7fffffff;
    uVar10 = 0;
    local_88 = ends;
    local_70 = starts;
    local_68 = List;
    local_60 = (vector<int,std::allocator<int>> *)ResIdx;
    local_58 = (vector<int,std::allocator<int>> *)ClashNum;
    do {
      iVar6 = (local_70->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar10];
      local_80 = uVar10;
      if (iVar6 <= (local_88->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar10]) {
        do {
          local_90 = 0;
          sVar1 = conf->_res[iVar6]._type;
          local_8c = iVar6;
          if ((sVar1 != 0) && (sVar1 != 5)) {
            if (0 < (int)local_50) {
              uVar10 = 0;
              do {
                iVar6 = (local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar10];
                lVar9 = (long)local_8c;
                local_40 = uVar10;
                if (iVar6 == local_8c) {
                  if (6 < conf->_res[local_8c]._numAtom) {
                    pRVar8 = conf->_res + local_8c;
                    lVar9 = 6;
                    do {
                      iVar2 = pRVar8->_atom[lVar9]._type;
                      if (iVar2 < 0x16 && iVar2 != -0x3039) {
                        pAVar7 = pRVar8->_atom + lVar9;
                        dVar15 = (pAVar7->super_Point).x;
                        if (((((dVar15 != 0.0) || (NAN(dVar15))) ||
                             (dVar15 = (pAVar7->super_Point).y, dVar15 != 0.0)) ||
                            ((NAN(dVar15) || (dVar15 = (pAVar7->super_Point).z, dVar15 != 0.0)))) ||
                           (NAN(dVar15))) {
                          lVar12 = 0;
                          do {
                            pAVar7 = conf->_res[iVar6]._atom;
                            iVar2 = *(int *)((long)&pAVar7[2]._type + lVar12);
                            if (iVar2 < 0x16 && iVar2 != -0x3039) {
                              dVar15 = *(double *)((long)&pAVar7[2].super_Point.x + lVar12);
                              if (((dVar15 != 0.0) || (NAN(dVar15))) ||
                                 ((dVar14 = *(double *)((long)&pAVar7[2].super_Point.y + lVar12),
                                  dVar14 != 0.0 ||
                                  (((NAN(dVar14) ||
                                    (dVar14 = *(double *)((long)&pAVar7[2].super_Point.z + lVar12),
                                    dVar14 != 0.0)) || (NAN(dVar14))))))) {
                                pAVar4 = conf->_res[local_8c]._atom;
                                dVar15 = pAVar4[lVar9].super_Point.x - dVar15;
                                dVar16 = pAVar4[lVar9].super_Point.y -
                                         *(double *)((long)&pAVar7[2].super_Point.y + lVar12);
                                dVar14 = pAVar4[lVar9].super_Point.z -
                                         *(double *)((long)&pAVar7[2].super_Point.z + lVar12);
                                dVar15 = dVar14 * dVar14 + dVar15 * dVar15 + dVar16 * dVar16;
                                if (dVar15 <= 64.0) {
                                  if (dVar15 < 0.0) {
                                    dVar15 = sqrt(dVar15);
                                  }
                                  else {
                                    dVar15 = SQRT(dVar15);
                                  }
                                  pRVar8 = conf->_res;
                                  iVar2 = pRVar8[local_8c]._atom[lVar9]._type;
                                  iVar3 = *(int *)((long)&pRVar8[iVar6]._atom[2]._type + lVar12);
                                  if ((pRVar8[local_8c]._type == 1) && (pRVar8[iVar6]._type == 1)) {
                                    if (iVar2 == 0x10) {
                                      if (((iVar3 == 0x10) && (1.8 < dVar15)) && (dVar15 < 2.2))
                                      goto LAB_0011821b;
                                      if (iVar3 != 4) goto LAB_001181ce;
                                    }
                                    else {
LAB_001181ce:
                                      if ((iVar2 != 4) || (iVar3 != 0x10)) goto LAB_001181f0;
                                    }
                                    if ((2.7 < dVar15) && (dVar15 < 3.3)) goto LAB_0011821b;
                                  }
LAB_001181f0:
                                  dVar15 = dVar15 / (Atom::radius[iVar2] + Atom::radius[iVar3]);
                                  if (dVar15 <= 0.6) {
                                    if (0.5 <= dVar15) {
                                      local_90 = local_90 + 1;
                                    }
                                    else {
                                      local_90 = local_90 + 5;
                                    }
                                  }
                                }
                              }
                            }
LAB_0011821b:
                            lVar12 = lVar12 + 0x50;
                          } while (lVar12 != 0xa0);
                        }
                      }
                      lVar9 = lVar9 + 1;
                      pRVar8 = conf->_res + local_8c;
                    } while (lVar9 < conf->_res[local_8c]._numAtom);
                  }
                }
                else if ((iVar6 <= local_8c) ||
                        ((local_88->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[local_80] < iVar6)) {
                  pRVar8 = conf->_res;
                  if ((iVar6 < local_8c) &&
                     ((local_70->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start[local_80] <= iVar6)) {
                    if (6 < pRVar8[local_8c]._numAtom) {
                      pRVar8 = pRVar8 + local_8c;
                      lVar9 = 6;
                      do {
                        iVar2 = pRVar8->_atom[lVar9]._type;
                        lVar12 = lVar9;
                        if (iVar2 < 0x16 && iVar2 != -0x3039) {
                          pAVar7 = pRVar8->_atom + lVar9;
                          dVar15 = (pAVar7->super_Point).x;
                          if ((((dVar15 != 0.0) || (NAN(dVar15))) ||
                              (dVar15 = (pAVar7->super_Point).y, dVar15 != 0.0)) ||
                             (((NAN(dVar15) || (dVar15 = (pAVar7->super_Point).z, dVar15 != 0.0)) ||
                              (NAN(dVar15))))) {
                            pRVar8 = conf->_res;
                            if (0 < pRVar8[iVar6]._numAtom) {
                              lVar13 = 0x18;
                              lVar11 = 0;
                              local_38 = lVar9;
                              do {
                                pAVar7 = pRVar8[iVar6]._atom;
                                iVar2 = *(int *)((long)&(pAVar7->super_Point).x + lVar13);
                                if (iVar2 < 0x16 && iVar2 != -0x3039) {
                                  dVar15 = *(double *)((long)pAVar7 + lVar13 + -0x18);
                                  if (((dVar15 != 0.0) || (NAN(dVar15))) ||
                                     ((dVar14 = *(double *)((long)pAVar7 + lVar13 + -0x10),
                                      dVar14 != 0.0 ||
                                      (((NAN(dVar14) ||
                                        (dVar14 = *(double *)((long)pAVar7 + lVar13 + -8),
                                        dVar14 != 0.0)) || (NAN(dVar14))))))) {
                                    pAVar4 = pRVar8[local_8c]._atom;
                                    dVar15 = pAVar4[lVar9].super_Point.x - dVar15;
                                    dVar16 = pAVar4[lVar9].super_Point.y -
                                             *(double *)((long)pAVar7 + lVar13 + -0x10);
                                    dVar14 = pAVar4[lVar9].super_Point.z -
                                             *(double *)((long)pAVar7 + lVar13 + -8);
                                    dVar15 = dVar14 * dVar14 + dVar15 * dVar15 + dVar16 * dVar16;
                                    if (dVar15 <= 64.0) {
                                      if (dVar15 < 0.0) {
                                        dVar15 = sqrt(dVar15);
                                        lVar12 = local_38;
                                      }
                                      else {
                                        dVar15 = SQRT(dVar15);
                                      }
                                      pRVar8 = conf->_res;
                                      iVar2 = pRVar8[local_8c]._atom[lVar9]._type;
                                      iVar3 = *(int *)((long)&((pRVar8[iVar6]._atom)->super_Point).x
                                                      + lVar13);
                                      if ((pRVar8[local_8c]._type == 1) &&
                                         (pRVar8[iVar6]._type == 1)) {
                                        if (iVar2 == 0x10) {
                                          if (((iVar3 == 0x10) && (1.8 < dVar15)) && (dVar15 < 2.2))
                                          goto LAB_001184b9;
                                          if (iVar3 != 4) goto LAB_0011846c;
                                        }
                                        else {
LAB_0011846c:
                                          if ((iVar2 != 4) || (iVar3 != 0x10)) goto LAB_0011848e;
                                        }
                                        if ((2.7 < dVar15) && (dVar15 < 3.3)) goto LAB_001184b9;
                                      }
LAB_0011848e:
                                      dVar15 = dVar15 / (Atom::radius[iVar2] + Atom::radius[iVar3]);
                                      if (dVar15 <= 0.6) {
                                        if (0.5 <= dVar15) {
                                          local_90 = local_90 + 1;
                                        }
                                        else {
                                          local_90 = local_90 + 5;
                                        }
                                      }
                                    }
                                  }
                                }
LAB_001184b9:
                                lVar11 = lVar11 + 1;
                                pRVar8 = conf->_res;
                                lVar13 = lVar13 + 0x50;
                              } while (lVar11 < pRVar8[iVar6]._numAtom);
                            }
                          }
                        }
                        lVar9 = lVar12 + 1;
                        pRVar8 = conf->_res + local_8c;
                      } while (lVar9 < conf->_res[local_8c]._numAtom);
                    }
                  }
                  else {
                    dVar16 = pRVar8[lVar9]._center.super_Point.x -
                             pRVar8[iVar6]._center.super_Point.x;
                    dVar15 = pRVar8[lVar9]._center.super_Point.y -
                             pRVar8[iVar6]._center.super_Point.y;
                    dVar14 = pRVar8[lVar9]._center.super_Point.z -
                             pRVar8[iVar6]._center.super_Point.z;
                    dVar15 = dVar14 * dVar14 + dVar16 * dVar16 + dVar15 * dVar15;
                    if (dVar15 < 0.0) {
                      dVar15 = sqrt(dVar15);
                    }
                    else {
                      dVar15 = SQRT(dVar15);
                    }
                    pRVar8 = conf->_res;
                    lVar9 = (long)local_8c;
                    if (Residue::size[pRVar8[lVar9]._type] + Residue::size[pRVar8[iVar6]._type] +
                        5.5 <= dVar15) {
                      dVar16 = pRVar8[lVar9]._bbc.super_Point.x -
                               pRVar8[iVar6]._center.super_Point.x;
                      dVar15 = pRVar8[lVar9]._bbc.super_Point.y -
                               pRVar8[iVar6]._center.super_Point.y;
                      dVar14 = pRVar8[lVar9]._bbc.super_Point.z -
                               pRVar8[iVar6]._center.super_Point.z;
                      dVar15 = dVar14 * dVar14 + dVar16 * dVar16 + dVar15 * dVar15;
                      if (dVar15 < 0.0) {
                        dVar15 = sqrt(dVar15);
                      }
                      else {
                        dVar15 = SQRT(dVar15);
                      }
                      if (Residue::bb_size + Residue::size[conf->_res[iVar6]._type] + 5.5 <= dVar15)
                      goto LAB_001188a3;
                    }
                    if (6 < conf->_res[local_8c]._numAtom) {
                      pRVar8 = conf->_res + local_8c;
                      lVar9 = 6;
                      do {
                        iVar2 = pRVar8->_atom[lVar9]._type;
                        if (iVar2 < 0x16 && iVar2 != -0x3039) {
                          pAVar7 = pRVar8->_atom + lVar9;
                          dVar15 = (pAVar7->super_Point).x;
                          if ((((((dVar15 != 0.0) || (NAN(dVar15))) ||
                                (dVar15 = (pAVar7->super_Point).y, dVar15 != 0.0)) ||
                               ((NAN(dVar15) || (dVar15 = (pAVar7->super_Point).z, dVar15 != 0.0))))
                              || (NAN(dVar15))) && (pRVar8 = conf->_res, 0 < pRVar8[iVar6]._numAtom)
                             ) {
                            lVar12 = 0x18;
                            lVar11 = 0;
                            do {
                              pAVar7 = pRVar8[iVar6]._atom;
                              iVar2 = *(int *)((long)&(pAVar7->super_Point).x + lVar12);
                              if (iVar2 < 0x16 && iVar2 != -0x3039) {
                                dVar15 = *(double *)((long)pAVar7 + lVar12 + -0x18);
                                if (((dVar15 != 0.0) || (NAN(dVar15))) ||
                                   ((dVar14 = *(double *)((long)pAVar7 + lVar12 + -0x10),
                                    dVar14 != 0.0 ||
                                    (((NAN(dVar14) ||
                                      (dVar14 = *(double *)((long)pAVar7 + lVar12 + -8),
                                      dVar14 != 0.0)) || (NAN(dVar14))))))) {
                                  pAVar4 = pRVar8[local_8c]._atom;
                                  dVar15 = pAVar4[lVar9].super_Point.x - dVar15;
                                  dVar16 = pAVar4[lVar9].super_Point.y -
                                           *(double *)((long)pAVar7 + lVar12 + -0x10);
                                  dVar14 = pAVar4[lVar9].super_Point.z -
                                           *(double *)((long)pAVar7 + lVar12 + -8);
                                  dVar15 = dVar14 * dVar14 + dVar15 * dVar15 + dVar16 * dVar16;
                                  if (dVar15 <= 64.0) {
                                    if (dVar15 < 0.0) {
                                      dVar15 = sqrt(dVar15);
                                    }
                                    else {
                                      dVar15 = SQRT(dVar15);
                                    }
                                    pRVar8 = conf->_res;
                                    iVar2 = pRVar8[local_8c]._atom[lVar9]._type;
                                    iVar3 = *(int *)((long)&((pRVar8[iVar6]._atom)->super_Point).x +
                                                    lVar12);
                                    if ((pRVar8[local_8c]._type == 1) && (pRVar8[iVar6]._type == 1))
                                    {
                                      if (iVar2 == 0x10) {
                                        if (((iVar3 == 0x10) && (1.8 < dVar15)) && (dVar15 < 2.2))
                                        goto LAB_0011885f;
                                        if (iVar3 != 4) goto LAB_00118812;
                                      }
                                      else {
LAB_00118812:
                                        if ((iVar2 != 4) || (iVar3 != 0x10)) goto LAB_00118834;
                                      }
                                      if ((2.7 < dVar15) && (dVar15 < 3.3)) goto LAB_0011885f;
                                    }
LAB_00118834:
                                    dVar15 = dVar15 / (Atom::radius[iVar2] + Atom::radius[iVar3]);
                                    if (dVar15 <= 0.6) {
                                      if (0.5 <= dVar15) {
                                        local_90 = local_90 + 1;
                                      }
                                      else {
                                        local_90 = local_90 + 5;
                                      }
                                    }
                                  }
                                }
                              }
LAB_0011885f:
                              lVar11 = lVar11 + 1;
                              pRVar8 = conf->_res;
                              lVar12 = lVar12 + 0x50;
                            } while (lVar11 < pRVar8[iVar6]._numAtom);
                          }
                        }
                        lVar9 = lVar9 + 1;
                        pRVar8 = conf->_res + local_8c;
                      } while (lVar9 < conf->_res[local_8c]._numAtom);
                    }
                  }
                }
LAB_001188a3:
                uVar10 = local_40 + 1;
              } while (uVar10 != local_48);
            }
            uVar10 = local_80;
            if (local_90 != 0) {
              iVar5._M_current = *(int **)(local_60 + 8);
              if (iVar5._M_current == *(int **)(local_60 + 0x10)) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (local_60,iVar5,&local_8c);
              }
              else {
                *iVar5._M_current = local_8c;
                *(int **)(local_60 + 8) = iVar5._M_current + 1;
              }
              iVar5._M_current = *(int **)(local_58 + 8);
              if (iVar5._M_current == *(int **)(local_58 + 0x10)) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (local_58,iVar5,&local_90);
                uVar10 = local_80;
              }
              else {
                *iVar5._M_current = local_90;
                *(int **)(local_58 + 8) = iVar5._M_current + 1;
                uVar10 = local_80;
              }
            }
          }
          iVar6 = local_8c + 1;
        } while (local_8c <
                 (local_88->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar10]);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != local_78);
  }
  return;
}

Assistant:

void Clash_detection_list(const Structure &conf, const vector<int> &starts, const vector<int> &ends, vector<int> &ResIdx,
                          vector<int> &ClashNum, const std::vector<int> &List) {
    int i, p, j, l, k, t, clash_count = 0;
    double disquare, dis, r, quot = 0;

    const int List_size = static_cast<int>(List.size());

    const int n_starts = static_cast<int>(starts.size());

    for (t = 0; t < n_starts; t++) {
        for (l = starts[t]; l <= ends[t]; l++) {
            if (conf._res[l]._type == 0 || conf._res[l]._type == 5)
                continue;
            for (p = 0; p < List_size; p++) {
                i = List[p];

                if (i == l) {
                    for (j = NUM_BB_ATOM; j < conf._res[l]._numAtom; j++) {
                        // skip undefined and H atoms
                        if (conf._res[l]._atom[j]._type == UNDEF || conf._res[l]._atom[j]._type >= 22)
                            continue;
                        if (conf._res[l]._atom[j].x == 0 && conf._res[l]._atom[j].y == 0 &&
                            conf._res[l]._atom[j].z == 0)
                            continue;

                        for (k = 2; k <= 3; ++k) {
                            if (conf._res[i]._atom[k]._type == UNDEF || conf._res[i]._atom[k]._type >= 22) continue;
                            if (conf._res[i]._atom[k].x == 0 && conf._res[i]._atom[k].y == 0 &&
                                conf._res[i]._atom[k].z == 0)
                                continue;

                            disquare = (conf._res[l]._atom[j].x - conf._res[i]._atom[k].x) *
                                       (conf._res[l]._atom[j].x - conf._res[i]._atom[k].x)
                                       + (conf._res[l]._atom[j].y - conf._res[i]._atom[k].y) *
                                         (conf._res[l]._atom[j].y - conf._res[i]._atom[k].y)
                                       + (conf._res[l]._atom[j].z - conf._res[i]._atom[k].z) *
                                         (conf._res[l]._atom[j].z - conf._res[i]._atom[k].z);
                            if (disquare <= PF_DIS_CUT_SQUARE) {
                                dis = sqrt(disquare);
                                r = Atom::radius[conf._res[l]._atom[j]._type] +
                                    Atom::radius[conf._res[i]._atom[k]._type];
                                if (conf._res[l]._type == 1 && conf._res[i]._type == 1) {
                                    if ((conf._res[l]._atom[j]._type == 16) && (conf._res[i]._atom[k]._type == 16) &&
                                        (dis > 1.8 && dis < 2.2)) {
                                        continue;
                                    }
                                    else if (((conf._res[l]._atom[j]._type == 16 && conf._res[i]._atom[k]._type == 4) ||
                                              (conf._res[l]._atom[j]._type == 4 &&
                                               conf._res[i]._atom[k]._type == 16)) && (dis > 2.7 && dis < 3.3)) {
                                        continue;
                                    }
                                    else {
                                        quot = dis / r;
                                        if (quot <= VDW_CLASH_CUTOFF) {
                                            if (quot <= VDW_CLASH_CUTOFF && quot >= 0.5)
                                                clash_count++;
                                            else {
                                                clash_count += 5;
                                            }
                                        }
                                    }
                                }
                                else {
                                    quot = dis / r;
                                    if (quot <= VDW_CLASH_CUTOFF) {
                                        if (quot <= VDW_CLASH_CUTOFF && quot >= 0.5)
                                            clash_count++;
                                        else {
                                            clash_count += 5;
                                        }
                                    }
                                }
                            }
                        }
                    }

                }
                else if (i > l && i <= ends[t]) continue;
                else if (i >= starts[t] && i < l) {
                    for (j = NUM_BB_ATOM; j < conf._res[l]._numAtom; j++) {
                        // skip undefined and H atoms
                        if (conf._res[l]._atom[j]._type == UNDEF || conf._res[l]._atom[j]._type >= 22)
                            continue;
                        if (conf._res[l]._atom[j].x == 0 && conf._res[l]._atom[j].y == 0 &&
                            conf._res[l]._atom[j].z == 0)
                            continue;

                        for (k = 0; k < conf._res[i]._numAtom; ++k) {
                            if (conf._res[i]._atom[k]._type == UNDEF || conf._res[i]._atom[k]._type >= 22) continue;
                            if (conf._res[i]._atom[k].x == 0 && conf._res[i]._atom[k].y == 0 &&
                                conf._res[i]._atom[k].z == 0)
                                continue;

                            disquare = (conf._res[l]._atom[j].x - conf._res[i]._atom[k].x) *
                                       (conf._res[l]._atom[j].x - conf._res[i]._atom[k].x)
                                       + (conf._res[l]._atom[j].y - conf._res[i]._atom[k].y) *
                                         (conf._res[l]._atom[j].y - conf._res[i]._atom[k].y)
                                       + (conf._res[l]._atom[j].z - conf._res[i]._atom[k].z) *
                                         (conf._res[l]._atom[j].z - conf._res[i]._atom[k].z);
                            if (disquare <= PF_DIS_CUT_SQUARE) {
                                dis = sqrt(disquare);
                                r = Atom::radius[conf._res[l]._atom[j]._type] +
                                    Atom::radius[conf._res[i]._atom[k]._type];
                                if (conf._res[l]._type == 1 && conf._res[i]._type == 1) {
                                    if ((conf._res[l]._atom[j]._type == 16) && (conf._res[i]._atom[k]._type == 16) &&
                                        (dis > 1.8 && dis < 2.2)) {
                                        continue;
                                    }
                                    else if (((conf._res[l]._atom[j]._type == 16 && conf._res[i]._atom[k]._type == 4) ||
                                              (conf._res[l]._atom[j]._type == 4 &&
                                               conf._res[i]._atom[k]._type == 16)) && (dis > 2.7 && dis < 3.3)) {
                                        continue;
                                    }
                                    else {
                                        quot = dis / r;
                                        if (quot <= VDW_CLASH_CUTOFF) {
                                            if (quot <= VDW_CLASH_CUTOFF && quot >= 0.5)
                                                clash_count++;
                                            else {
                                                clash_count += 5;
                                            }
                                        }
                                    }
                                }
                                else {
                                    quot = dis / r;
                                    if (quot <= VDW_CLASH_CUTOFF) {
                                        if (quot <= VDW_CLASH_CUTOFF && quot >= 0.5)
                                            clash_count++;
                                        else {
                                            clash_count += 5;
                                        }
                                    }
                                }
                            }
                        }
                    }

                }
                else {
                    if ((conf._res[l]._center.dis(conf._res[i]._center) <
                         Residue::size[conf._res[l]._type] + Residue::size[conf._res[i]._type] + CUB_SIZE) ||
                        (conf._res[l]._bbc.dis(conf._res[i]._center) <
                         Residue::bb_size + Residue::size[conf._res[i]._type] + CUB_SIZE)) {
                        for (j = NUM_BB_ATOM; j < conf._res[l]._numAtom; j++) {
                            // skip undefined and H atoms
                            if (conf._res[l]._atom[j]._type == UNDEF || conf._res[l]._atom[j]._type >= 22)
                                continue;
                            if (conf._res[l]._atom[j].x == 0 && conf._res[l]._atom[j].y == 0 &&
                                conf._res[l]._atom[j].z == 0)
                                continue;
                            for (k = 0; k < conf._res[i]._numAtom; ++k) {
                                if (conf._res[i]._atom[k]._type == UNDEF || conf._res[i]._atom[k]._type >= 22) continue;
                                if (conf._res[i]._atom[k].x == 0 && conf._res[i]._atom[k].y == 0 &&
                                    conf._res[i]._atom[k].z == 0)
                                    continue;

                                disquare = (conf._res[l]._atom[j].x - conf._res[i]._atom[k].x) *
                                           (conf._res[l]._atom[j].x - conf._res[i]._atom[k].x)
                                           + (conf._res[l]._atom[j].y - conf._res[i]._atom[k].y) *
                                             (conf._res[l]._atom[j].y - conf._res[i]._atom[k].y)
                                           + (conf._res[l]._atom[j].z - conf._res[i]._atom[k].z) *
                                             (conf._res[l]._atom[j].z - conf._res[i]._atom[k].z);
                                if (disquare <= PF_DIS_CUT_SQUARE) {
                                    dis = sqrt(disquare);
                                    r = Atom::radius[conf._res[l]._atom[j]._type] +
                                        Atom::radius[conf._res[i]._atom[k]._type];
                                    if (conf._res[l]._type == 1 && conf._res[i]._type == 1) {
                                        if ((conf._res[l]._atom[j]._type == 16) &&
                                            (conf._res[i]._atom[k]._type == 16) && (dis > 1.8 && dis < 2.2)) {
                                            continue;
                                        }
                                        else if (((conf._res[l]._atom[j]._type == 16 &&
                                                   conf._res[i]._atom[k]._type == 4) ||
                                                  (conf._res[l]._atom[j]._type == 4 &&
                                                   conf._res[i]._atom[k]._type == 16)) && (dis > 2.7 && dis < 3.3)) {
                                            continue;
                                        }
                                        else {
                                            quot = dis / r;
                                            if (quot <= VDW_CLASH_CUTOFF) {
                                                if (quot <= VDW_CLASH_CUTOFF && quot >= 0.5)
                                                    clash_count++;
                                                else {
                                                    clash_count += 5;
                                                }
                                            }
                                        }
                                    }
                                    else {
                                        quot = dis / r;
                                        if (quot <= VDW_CLASH_CUTOFF) {
                                            if (quot <= VDW_CLASH_CUTOFF && quot >= 0.5)
                                                clash_count++;
                                            else {
                                                clash_count += 5;
                                            }
                                        }
                                    }
                                }
                            }
                        }
                    }
                }
            }
            if (clash_count != 0) {
                ResIdx.push_back(l);
                ClashNum.push_back(clash_count);
            }
            clash_count = 0;
        }
    }
}